

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O2

void Abc_FlowRetime_ClearInitToOrig(Abc_Obj_t *pInit)

{
  int iVar1;
  int iVar2;
  MinRegMan_t *pMVar3;
  NodeLag_t *pNVar4;
  int iVar5;
  
  pMVar3 = pManMR;
  iVar1 = pInit->Id;
  iVar2 = pManMR->sizeInitToOrig;
  if (iVar1 < iVar2) {
    pNVar4 = pManMR->pInitToOrig;
  }
  else {
    iVar5 = (int)((double)iVar1 * 1.5 + 10.0);
    pManMR->sizeInitToOrig = iVar5;
    pNVar4 = (NodeLag_t *)realloc(pMVar3->pInitToOrig,(long)iVar5 << 3);
    pMVar3 = pManMR;
    pManMR->pInitToOrig = pNVar4;
    memset(pNVar4 + iVar2,0,((long)pMVar3->sizeInitToOrig - (long)iVar2) * 8);
  }
  if (pNVar4 != (NodeLag_t *)0x0) {
    pNVar4[iVar1].id = -1;
    return;
  }
  __assert_fail("pManMR->pInitToOrig",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                ,0x4f4,"void Abc_FlowRetime_ClearInitToOrig(Abc_Obj_t *)");
}

Assistant:

void Abc_FlowRetime_ClearInitToOrig( Abc_Obj_t *pInit )
{
  int id = Abc_ObjId( pInit );
  
  // grow data structure if necessary
  if (id >= pManMR->sizeInitToOrig) {
    int oldSize = pManMR->sizeInitToOrig;
    pManMR->sizeInitToOrig = 1.5*id + 10;
    pManMR->pInitToOrig = (NodeLag_t*)realloc(pManMR->pInitToOrig, sizeof(NodeLag_t)*pManMR->sizeInitToOrig);
    memset( &(pManMR->pInitToOrig[oldSize]), 0, sizeof(NodeLag_t)*(pManMR->sizeInitToOrig-oldSize) );
  }
  assert( pManMR->pInitToOrig );

  pManMR->pInitToOrig[id].id = -1;
}